

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall Heap<4U>::Heap(Heap<4U> *this,uint32_t _SIZE)

{
  void *pvVar1;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  ulong uVar2;
  void *local_50;
  
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = in_ESI;
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x118a33);
  uVar2 = (ulong)*(uint *)((long)in_RDI + 0xc);
  pvVar1 = operator_new__(uVar2 << 3);
  if (uVar2 != 0) {
    local_50 = pvVar1;
    do {
      Counter::Counter((Counter *)0x118a8f);
      local_50 = (void *)((long)local_50 + 8);
    } while (local_50 != (void *)((long)pvVar1 + uVar2 * 8));
  }
  *in_RDI = pvVar1;
  memset((void *)*in_RDI,0,(ulong)*(uint *)((long)in_RDI + 0xc) << 3);
  return;
}

Assistant:

Heap(uint32_t _SIZE) : SIZE(_SIZE), heap_num(0) {
		heaps = new Counter[SIZE];
		memset(heaps, 0, SIZE * sizeof(Counter));
	}